

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O3

ENGINE * scep_engine_load_dynamic(ENGINE *e)

{
  char *arg;
  NAME_VALUE_PAIR **ppNVar1;
  int iVar2;
  ENGINE *e_00;
  ENGINE *extraout_RAX;
  long lVar3;
  NAME_VALUE_PAIR *pNVar4;
  
  e_00 = ENGINE_by_id("dynamic");
  if (e_00 == (ENGINE *)0x0) {
LAB_00108afe:
    scep_engine_load_dynamic_cold_6();
LAB_00108b03:
    scep_engine_load_dynamic_cold_5();
  }
  else {
    if (v_flag != 0) {
      printf("%s: Engine dynamic was loaded\n",pname);
    }
    arg = scep_conf->engine->dynamic_path;
    if (arg != (char *)0x0) {
      iVar2 = ENGINE_ctrl_cmd_string(e_00,"SO_PATH",arg,0);
      if (iVar2 == 0) goto LAB_00108b0d;
      if (v_flag != 0) {
        printf("%s: %s was found.\n",pname,g_char);
      }
    }
    iVar2 = ENGINE_ctrl_cmd_string(e_00,"LIST_ADD","1",0);
    if (iVar2 == 0) goto LAB_00108b03;
    if (v_flag != 0) {
      printf("%s: Added %s to list of engines.\n",pname,g_char);
    }
    iVar2 = ENGINE_ctrl_cmd_string(e_00,"LOAD",(char *)0x0,0);
    if (iVar2 != 0) {
      if (v_flag != 0) {
        printf("%s: Loading engine %s succeeded\n",pname,g_char);
      }
      ppNVar1 = scep_conf->engine->cmds;
      if ((ppNVar1 != (NAME_VALUE_PAIR **)0x0) &&
         (pNVar4 = *ppNVar1, pNVar4 != (NAME_VALUE_PAIR *)0x0)) {
        lVar3 = 8;
        do {
          iVar2 = ENGINE_ctrl_cmd_string(e_00,pNVar4->name,pNVar4->value,0);
          if (iVar2 == 0) {
            scep_engine_load_dynamic_cold_3();
            goto LAB_00108afe;
          }
          if (v_flag != 0) {
            scep_engine_load_dynamic_cold_2();
          }
          pNVar4 = *(NAME_VALUE_PAIR **)((long)scep_conf->engine->cmds + lVar3);
          lVar3 = lVar3 + 8;
        } while (pNVar4 != (NAME_VALUE_PAIR *)0x0);
      }
      return (ENGINE *)e_00;
    }
  }
  scep_engine_load_dynamic_cold_4();
LAB_00108b0d:
  scep_engine_load_dynamic_cold_1();
  OPENSSL_init_crypto(2,0);
  ERR_print_errors_fp(_stderr);
  return extraout_RAX;
}

Assistant:

ENGINE *scep_engine_load_dynamic(ENGINE *e) {
    //it seems OpenSSL did not already have it. In this case we will try to load it dynamically
    e = ENGINE_by_id("dynamic");

    //if we can't even load the dynamic engine, something is seriously wrong. We can't go on from here!
    if(e == NULL) {
        fprintf(stderr, "%s: Engine dynamic could not be loaded, Error message\n", pname);
        sscep_engine_report_error();
        exit (SCEP_PKISTATUS_ERROR);
    } else if(v_flag)
        printf("%s: Engine dynamic was loaded\n", pname);

    //To load dynamically we have to tell openssl where to find it.
    if(scep_conf->engine->dynamic_path) {
        if(ENGINE_ctrl_cmd_string(e, "SO_PATH", scep_conf->engine->dynamic_path, 0) == 0) {
            fprintf(stderr, "%s: Loading %s did not succeed\n", pname, g_char);
            sscep_engine_report_error();
            exit (SCEP_PKISTATUS_ERROR);
        } else if (v_flag)
            printf("%s: %s was found.\n", pname, g_char);
    }

    //engine will be added to the list of available engines. Should be done for complete import.
    if(ENGINE_ctrl_cmd_string(e, "LIST_ADD", "1", 0) == 0) {
        fprintf(stderr, "%s: Executing LIST_ADD did not succeed:\n", pname);
        sscep_engine_report_error();
        exit (SCEP_PKISTATUS_ERROR);
    } else if(v_flag)
        printf("%s: Added %s to list of engines.\n", pname, g_char);

    /*if(!ENGINE_ctrl(e, (ENGINE_CMD_BASE + 12), 0, (void*)"REQUEST", NULL)) {
    } else if(v_flag)
        printf("Altered storename to %s\n", "REQUEST");*/

    //Finally we load the engine.
    if(ENGINE_ctrl_cmd_string(e, "LOAD", NULL, 0) == 0) {
        fprintf(stderr, "%s: Executing LOAD did not succeed:\n", pname);
        sscep_engine_report_error();
        exit (SCEP_PKISTATUS_ERROR);
    } else if(v_flag)
        printf("%s: Loading engine %s succeeded\n", pname, g_char);

    // Now issue any dynamic engine init cmds if any are configured
    if(scep_conf->engine->cmds != NULL) {
        int i=0;
        while(scep_conf->engine->cmds[i] != NULL) {
                 NAME_VALUE_PAIR *cmd = scep_conf->engine->cmds[i];
                 if(ENGINE_ctrl_cmd_string(e, cmd->name, cmd->value, 0) == 0) {
                         fprintf(stderr, "%s: Executing %s=%s failed\n", pname, cmd->name, cmd->value);
                         sscep_engine_report_error();
                         exit (SCEP_PKISTATUS_ERROR);
                 } else if(v_flag) {
                         fprintf(stderr, "%s: Engine command %s=%s succeeded\n", pname, cmd->name, cmd->value);
                 }
                 i++;
         }
    }

    //all these functions were only needed if we loaded dynamically. Otherwise we could just skip this step.

    return e;
}